

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double i4vec_mean(int n,int *x)

{
  double local_28;
  double mean;
  int i;
  int *x_local;
  int n_local;
  
  local_28 = 0.0;
  for (mean._4_4_ = 0; mean._4_4_ < n; mean._4_4_ = mean._4_4_ + 1) {
    local_28 = local_28 + (double)x[mean._4_4_];
  }
  return local_28 / (double)n;
}

Assistant:

double i4vec_mean ( int n, int x[] )

//****************************************************************************80
//
//  Purpose:
//
//    I4VEC_MEAN returns the mean of an I4VEC.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 May 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, int X[N], the vector whose mean is desired.
//
//    Output, double I4VEC_MEAN, the mean, or average, of the vector entries.
//
{
  int i;
  double mean;

  mean = 0.0;
  for ( i = 0; i < n; i++ )
  {
    mean = mean + static_cast< double > ( x[i]);
  }

  mean = mean / static_cast< double > ( n);

  return mean;
}